

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_null.c
# Opt level: O0

int null_cipher(void *vctx,uchar *out,size_t *outl,size_t outsize,uchar *in,size_t inl)

{
  int iVar1;
  ulong in_RCX;
  ulong *in_RDX;
  void *in_RSI;
  int *in_RDI;
  void *in_R8;
  ulong in_R9;
  PROV_CIPHER_NULL_CTX *ctx;
  ulong local_38;
  int local_4;
  
  iVar1 = ossl_prov_is_running();
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    local_38 = in_R9;
    if ((*in_RDI == 0) && (*(long *)(in_RDI + 2) != 0)) {
      if (in_R9 < *(ulong *)(in_RDI + 2)) {
        return 0;
      }
      *(ulong *)(in_RDI + 4) = (long)in_R8 + (in_R9 - *(long *)(in_RDI + 2));
      local_38 = in_R9 - *(long *)(in_RDI + 2);
    }
    if (in_RCX < local_38) {
      local_4 = 0;
    }
    else {
      if (in_R8 != in_RSI) {
        memcpy(in_RSI,in_R8,local_38);
      }
      *in_RDX = local_38;
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int null_cipher(void *vctx, unsigned char *out, size_t *outl,
                       size_t outsize, const unsigned char *in, size_t inl)
{
    PROV_CIPHER_NULL_CTX *ctx = (PROV_CIPHER_NULL_CTX *)vctx;

    if (!ossl_prov_is_running())
        return 0;

    if (!ctx->enc && ctx->tlsmacsize > 0) {
        /*
         * TLS NULL cipher as per:
         * https://tools.ietf.org/html/rfc5246#section-6.2.3.1
         */
        if (inl < ctx->tlsmacsize)
            return 0;
        ctx->tlsmac = in + inl - ctx->tlsmacsize;
        inl -= ctx->tlsmacsize;
    }
    if (outsize < inl)
        return 0;
    if (in != out)
        memcpy(out, in, inl);
    *outl = inl;
    return 1;
}